

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineGenDrawCommands::Run(AdvancedPipelineGenDrawCommands *this)

{
  CallLogWrapper *this_00;
  RenderTarget *pRVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  GLuint GVar5;
  GLint location;
  vec4 *epsilon;
  bool *compile_error;
  bool *compile_error_00;
  vec4 *c1;
  int x;
  long lVar6;
  long lVar7;
  long lVar8;
  GLsizeiptr offset;
  void *indirect;
  int i;
  int v0;
  long lVar9;
  ComputeShaderBase *pCVar10;
  int y;
  ulong uVar11;
  Vector<float,_3> local_238;
  Vector<float,_3> local_228;
  Vector<float,_3> local_218;
  undefined1 local_208 [32];
  vec3 local_1e8;
  GLint res;
  string local_1d8;
  GLushort data [16];
  Matrix<float,_4,_4> local_178;
  Matrix<float,_4,_4> local_138;
  Matrix<float,_4,_4> local_f8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90d6,&res);
  if (res < 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0",
               (allocator<char> *)data);
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(local_size_x = 4) in;\nstruct DrawCommand {\n  uint count;\n  uint instance_count;\n  uint first_index;\n  int base_vertex;\n  uint base_instance;\n};\nlayout(std430) buffer;\nlayout(binding = 0) readonly buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nlayout(binding = 1) writeonly buffer DrawCommandBuffer {\n  DrawCommand g_command[4];\n};\nbool IsObjectVisible(uint id) {\n  if (g_objects.transform[id][3].x < -1.0 || g_objects.transform[id][3].x > 1.0) return false;\n  if (g_objects.transform[id][3][1] < -1.0 || g_objects.transform[id][3][1] > 1.0) return false;\n  if (g_objects.transform[id][3][2] < -1.0 || g_objects.transform[id][3].z > 1.0) return false;\n  return true;\n}\nvoid main() {\n  uint id = gl_GlobalInvocationID.x;\n  g_command[id].count = 0;\n  g_command[id].instance_count = 0;\n  g_command[id].first_index = 0;\n  g_command[id].base_vertex = 0;\n  g_command[id].base_instance = 0;\n  if (IsObjectVisible(id)) {\n    g_command[id].count = g_objects.count[id];\n    g_command[id].instance_count = 1;\n    g_command[id].first_index = g_objects.first_index[id];\n  }\n}"
               ,(allocator<char> *)local_208);
    GVar5 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)data);
    this->m_program[0] = GVar5;
    std::__cxx11::string::~string((string *)data);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
    bVar3 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[0],compile_error);
    if (!bVar3) {
      return -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)data,
               "\nlayout(location = 0) in vec4 g_position;\nlayout(location = 1) in vec3 g_color;\nout StageData {\n  vec3 color;\n} g_vs_out;\nlayout(binding = 0, std430) buffer ObjectBuffer {\n  mat4 transform[4];\n  uint count[4];\n  uint first_index[4];\n} g_objects;\nuniform int g_object_id;\nvoid main() {\n  gl_Position = g_objects.transform[g_object_id] * g_position;\n  g_vs_out.color = g_color;\n}"
               ,(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_208,
               "\nin StageData {\n  vec3 color;\n} g_fs_in;\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(g_fs_in.color, 1);\n}"
               ,(allocator<char> *)&local_238);
    GVar5 = ComputeShaderBase::CreateProgram
                      (&this->super_ComputeShaderBase,(string *)data,(string *)local_208);
    this->m_program[1] = GVar5;
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)data);
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
    bVar3 = ComputeShaderBase::CheckProgram
                      (&this->super_ComputeShaderBase,this->m_program[1],compile_error_00);
    if (!bVar3) {
      return -1;
    }
    glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
    local_208._0_8_ = &DAT_bf000000bfc00000;
    local_208._8_4_ = 0.0;
    tcu::translationMatrix<float,_3>((Matrix<float,_4,_4> *)data,(Vector<float,_3> *)local_208);
    local_218.m_data[0] = 0.5;
    local_218.m_data[1] = -0.5;
    local_218.m_data[2] = 0.0;
    tcu::translationMatrix<float,_3>(&local_178,&local_218);
    local_238.m_data[0] = -0.5;
    local_238.m_data[1] = 0.5;
    local_238.m_data[2] = 0.0;
    tcu::translationMatrix<float,_3>(&local_138,&local_238);
    local_228.m_data._0_8_ = &DAT_3f0000003f000000;
    local_228.m_data[2] = 0.0;
    tcu::translationMatrix<float,_3>(&local_f8,&local_228);
    local_b8 = 0x400000004;
    uStack_b0 = 0x400000004;
    local_a8 = 0x400000000;
    uStack_a0 = 0xc00000008;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_object_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_object_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x120,data,0x88e4);
    data[0] = 0xcccd;
    data[1] = 0xbecc;
    data[2] = 0xcccd;
    data[3] = 0xbecc;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0x3f80;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0xcccd;
    data[0xd] = 0x3ecc;
    data[0xe] = 0xcccd;
    data[0xf] = 0xbecc;
    local_178.m_data.m_data[0].m_data[0] = 0.0;
    local_178.m_data.m_data[0].m_data[1] = 0.0;
    local_178.m_data.m_data[0].m_data[2] = 0.4;
    local_178.m_data.m_data[0].m_data[3] = 0.4;
    local_178.m_data.m_data[1].m_data[0] = 0.0;
    local_178.m_data.m_data[1].m_data[1] = 1.0;
    local_178.m_data.m_data[1].m_data[2] = 0.0;
    local_178.m_data.m_data[1].m_data[3] = 0.0;
    local_178.m_data.m_data[2].m_data[0] = -0.4;
    local_178.m_data.m_data[2].m_data[1] = -0.4;
    local_178.m_data.m_data[2].m_data[2] = 0.0;
    local_178.m_data.m_data[2].m_data[3] = 0.0;
    local_178.m_data.m_data[3].m_data[0] = 1.0;
    local_178.m_data.m_data[3].m_data[1] = 0.0;
    local_178.m_data.m_data[3].m_data[2] = 0.4;
    local_178.m_data.m_data[3].m_data[3] = -0.4;
    local_138.m_data.m_data[0].m_data[0] = 0.0;
    local_138.m_data.m_data[0].m_data[1] = 0.0;
    local_138.m_data.m_data[0].m_data[2] = 1.0;
    local_138.m_data.m_data[0].m_data[3] = 0.0;
    local_138.m_data.m_data[1].m_data[0] = -0.4;
    local_138.m_data.m_data[1].m_data[1] = 0.4;
    local_138.m_data.m_data[1].m_data[2] = 0.0;
    local_138.m_data.m_data[1].m_data[3] = 0.0;
    local_138.m_data.m_data[2].m_data[0] = 1.0;
    local_138.m_data.m_data[2].m_data[1] = 0.0;
    local_138.m_data.m_data[2].m_data[2] = 0.4;
    local_138.m_data.m_data[2].m_data[3] = 0.4;
    local_138.m_data.m_data[3].m_data[0] = 0.0;
    local_138.m_data.m_data[3].m_data[1] = 0.0;
    local_138.m_data.m_data[3].m_data[2] = 1.0;
    local_138.m_data.m_data[3].m_data[3] = 0.0;
    local_f8.m_data.m_data[0].m_data[0] = -0.4;
    local_f8.m_data.m_data[0].m_data[1] = -0.4;
    local_f8.m_data.m_data[0].m_data[2] = 0.0;
    local_f8.m_data.m_data[0].m_data[3] = 0.0;
    local_f8.m_data.m_data[1].m_data[0] = 0.0;
    local_f8.m_data.m_data[1].m_data[1] = 1.0;
    local_f8.m_data.m_data[1].m_data[2] = 0.4;
    local_f8.m_data.m_data[1].m_data[3] = -0.4;
    local_f8.m_data.m_data[2].m_data[0] = 0.0;
    local_f8.m_data.m_data[2].m_data[1] = 0.0;
    local_f8.m_data.m_data[2].m_data[2] = 0.0;
    local_f8.m_data.m_data[2].m_data[3] = 1.0;
    local_f8.m_data.m_data[3].m_data[0] = -0.4;
    local_f8.m_data.m_data[3].m_data[1] = 0.4;
    local_f8.m_data.m_data[3].m_data[2] = 0.0;
    local_f8.m_data.m_data[3].m_data[3] = 0.0;
    local_b8 = 0x3f80000000000000;
    uStack_b0 = 0x3ecccccd3ecccccd;
    local_a8 = 0;
    uStack_a0 = 0x3f80000000000000;
    local_98 = 0xbecccccdbecccccd;
    uStack_90 = 0x3f80000000000000;
    local_88 = 0x3f800000;
    uStack_80 = 0xbecccccd3ecccccd;
    local_78 = 0x3f80000000000000;
    uStack_70 = 0x3f800000;
    local_68 = 0x3ecccccdbecccccd;
    uStack_60 = 0x3f80000000000000;
    local_58 = 0x3f800000;
    uStack_50 = 0x3ecccccd3ecccccd;
    local_48 = 0x3f80000000000000;
    uStack_40 = 0x3f800000;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_vertex_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x180,data,0x88e4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    data[8] = 8;
    data[9] = 9;
    data[10] = 10;
    data[0xb] = 0xb;
    data[0xc] = 0xc;
    data[0xd] = 0xd;
    data[0xe] = 0xe;
    data[0xf] = 0xf;
    data[0] = 0;
    data[1] = 1;
    data[2] = 2;
    data[3] = 3;
    data[4] = 4;
    data[5] = 5;
    data[6] = 6;
    data[7] = 7;
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_index_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_index_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8893,0x20,data,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,0);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_draw_buffer);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->m_draw_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x50,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,0);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_vertex_buffer);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,3,0x1406,'\0',0x18,(void *)0x0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,3,0x1406,'\0',0x18,(void *)0xc);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->m_index_buffer);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_draw_buffer);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glClear(this_00,0x4000);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->m_draw_buffer);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x40);
    v0 = 0;
    for (indirect = (void *)0x0; (int)indirect != 0x50; indirect = (void *)((long)indirect + 0x14))
    {
      location = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program[1],"g_object_id")
      ;
      glu::CallLogWrapper::glUniform1i(this_00,location,v0);
      glu::CallLogWrapper::glDrawElementsIndirect(this_00,5,0x1403,indirect);
      v0 = v0 + 1;
    }
    pRVar1 = (this->super_ComputeShaderBase).renderTarget;
    if ((99 < pRVar1->m_width) && (99 < pRVar1->m_height)) {
      tcu::Vector<float,_3>::Vector(&local_218,0.0);
      local_238.m_data[0] = 0.0;
      local_238.m_data[1] = 1.0;
      local_238.m_data[2] = 0.0;
      local_228.m_data[0] = 1.0;
      local_228.m_data[1] = 1.0;
      local_228.m_data[2] = 0.0;
      local_1e8.m_data[0] = 0.0;
      local_1e8.m_data[1] = 0.0;
      local_1e8.m_data[2] = 1.0;
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)data,
                 10000,(allocator_type *)local_208);
      epsilon = (vec4 *)0x64;
      glu::CallLogWrapper::glReadPixels(this_00,0,0,100,100,0x1907,0x1406,(void *)data._0_8_);
      c1 = &(this->super_ComputeShaderBase).g_color_eps;
      bVar3 = true;
      lVar6 = 0x2f58;
      for (uVar11 = 10; uVar11 != 0x28; uVar11 = uVar11 + 1) {
        lVar7 = lVar6;
        for (lVar9 = -0x1e; uVar2 = data._0_8_, lVar9 != 0; lVar9 = lVar9 + 1) {
          bVar4 = ComputeShaderBase::ColorEqual
                            ((ComputeShaderBase *)(data._0_8_ + lVar7),&local_218,(vec3 *)c1,epsilon
                            );
          if (!bVar4) {
            anon_unknown_0::Output
                      ("First bad color (%d, %d): %f %f %f\n",
                       SUB84((double)*(float *)(uVar2 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 4 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 8 + lVar7),0),(ulong)((int)lVar9 + 0x28),
                       uVar11 & 0xffffffff);
            bVar3 = false;
          }
          lVar7 = lVar7 + 0xc;
        }
        lVar6 = lVar6 + 0x4b0;
      }
      lVar6 = 0x31b0;
      for (uVar11 = 10; uVar11 != 0x28; uVar11 = uVar11 + 1) {
        lVar7 = lVar6;
        for (lVar9 = -0x1e; uVar2 = data._0_8_, lVar9 != 0; lVar9 = lVar9 + 1) {
          bVar4 = ComputeShaderBase::ColorEqual
                            ((ComputeShaderBase *)(data._0_8_ + lVar7),&local_238,(vec3 *)c1,epsilon
                            );
          if (!bVar4) {
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",
                       SUB84((double)*(float *)(uVar2 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 4 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 8 + lVar7),0),(ulong)((int)lVar9 + 0x5a),
                       uVar11 & 0xffffffff);
            bVar3 = false;
          }
          lVar7 = lVar7 + 0xc;
        }
        lVar6 = lVar6 + 0x4b0;
      }
      lVar6 = 0x11c10;
      for (uVar11 = 0x3c; uVar11 != 0x5a; uVar11 = uVar11 + 1) {
        lVar7 = lVar6;
        for (lVar9 = -0x1e; uVar2 = data._0_8_, lVar9 != 0; lVar9 = lVar9 + 1) {
          bVar4 = ComputeShaderBase::ColorEqual
                            ((ComputeShaderBase *)(data._0_8_ + lVar7),&local_228,(vec3 *)c1,epsilon
                            );
          if (!bVar4) {
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",
                       SUB84((double)*(float *)(uVar2 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 4 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 8 + lVar7),0),(ulong)((int)lVar9 + 0x5a),
                       uVar11 & 0xffffffff);
            bVar3 = false;
          }
          lVar7 = lVar7 + 0xc;
        }
        lVar6 = lVar6 + 0x4b0;
      }
      lVar6 = 0x119b8;
      for (uVar11 = 0x3c; uVar11 != 0x5a; uVar11 = uVar11 + 1) {
        lVar7 = lVar6;
        for (lVar9 = -0x1e; uVar2 = data._0_8_, lVar9 != 0; lVar9 = lVar9 + 1) {
          bVar4 = ComputeShaderBase::ColorEqual
                            ((ComputeShaderBase *)(data._0_8_ + lVar7),&local_1e8,(vec3 *)c1,epsilon
                            );
          if (!bVar4) {
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",
                       SUB84((double)*(float *)(uVar2 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 4 + lVar7),0),
                       SUB84((double)*(float *)(uVar2 + 8 + lVar7),0),(ulong)((int)lVar9 + 0x28),
                       uVar11 & 0xffffffff);
            bVar3 = false;
          }
          lVar7 = lVar7 + 0xc;
        }
        lVar6 = lVar6 + 0x4b0;
      }
      lVar9 = 0xe100;
      for (lVar6 = 0x30; lVar6 != 0x34; lVar6 = lVar6 + 1) {
        lVar7 = lVar9;
        for (uVar11 = 0; uVar11 != 100; uVar11 = uVar11 + 1) {
          pCVar10 = (ComputeShaderBase *)(data._0_8_ + lVar7);
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_208,0.0);
          bVar4 = ComputeShaderBase::ColorEqual
                            (pCVar10,(Vector<float,_3> *)local_208,(vec3 *)c1,epsilon);
          if (!bVar4) {
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",
                       SUB84((double)*(float *)(data._0_8_ + lVar7),0),
                       SUB84((double)*(float *)(data._0_8_ + 4 + lVar7),0),
                       SUB84((double)*(float *)(data._0_8_ + 8 + lVar7),0),uVar11 & 0xffffffff,lVar6
                      );
            bVar3 = false;
          }
          lVar7 = lVar7 + 0xc;
        }
        lVar9 = lVar9 + 0x4b0;
      }
      lVar9 = 0x240;
      for (lVar6 = 0; lVar6 != 100; lVar6 = lVar6 + 1) {
        lVar8 = lVar9;
        for (lVar7 = -4; lVar7 != 0; lVar7 = lVar7 + 1) {
          pCVar10 = (ComputeShaderBase *)(data._0_8_ + lVar8);
          tcu::Vector<float,_3>::Vector((Vector<float,_3> *)local_208,0.0);
          bVar4 = ComputeShaderBase::ColorEqual
                            (pCVar10,(Vector<float,_3> *)local_208,(vec3 *)c1,epsilon);
          if (!bVar4) {
            anon_unknown_0::Output
                      ("Bad color at (%d, %d): %f %f %f\n",
                       SUB84((double)*(float *)(data._0_8_ + lVar8),0),
                       SUB84((double)*(float *)(data._0_8_ + 4 + lVar8),0),
                       SUB84((double)*(float *)(data._0_8_ + 8 + lVar8),0),
                       (ulong)((int)lVar7 + 0x34),lVar6);
            bVar3 = false;
          }
          lVar8 = lVar8 + 0xc;
        }
        lVar9 = lVar9 + 0x4b0;
      }
      std::_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::
      ~_Vector_base((_Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                    data);
      if (!bVar3) {
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

virtual long Run()
	{
		GLint res;
		glGetIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &res);
		if (res <= 0)
		{
			OutputNotSupported("GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS <= 0");
			return NO_ERROR;
		}

		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "struct DrawCommand {" NL "  uint count;" NL
			   "  uint instance_count;" NL "  uint first_index;" NL "  int base_vertex;" NL "  uint base_instance;" NL
			   "};" NL "layout(std430) buffer;" NL "layout(binding = 0) readonly buffer ObjectBuffer {" NL
			   "  mat4 transform[4];" NL "  uint count[4];" NL "  uint first_index[4];" NL "} g_objects;" NL
			   "layout(binding = 1) writeonly buffer DrawCommandBuffer {" NL "  DrawCommand g_command[4];" NL "};" NL
			   "bool IsObjectVisible(uint id) {" NL
			   "  if (g_objects.transform[id][3].x < -1.0 || g_objects.transform[id][3].x > 1.0) return false;" NL
			   "  if (g_objects.transform[id][3][1] < -1.0 || g_objects.transform[id][3][1] > 1.0) return false;" NL
			   "  if (g_objects.transform[id][3][2] < -1.0 || g_objects.transform[id][3].z > 1.0) return false;" NL
			   "  return true;" NL "}" NL "void main() {" NL "  uint id = gl_GlobalInvocationID.x;" NL
			   "  g_command[id].count = 0;" NL "  g_command[id].instance_count = 0;" NL
			   "  g_command[id].first_index = 0;" NL "  g_command[id].base_vertex = 0;" NL
			   "  g_command[id].base_instance = 0;" NL "  if (IsObjectVisible(id)) {" NL
			   "    g_command[id].count = g_objects.count[id];" NL "    g_command[id].instance_count = 1;" NL
			   "    g_command[id].first_index = g_objects.first_index[id];" NL "  }" NL "}";
		m_program[0] = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_vs =
			NL "layout(location = 0) in vec4 g_position;" NL "layout(location = 1) in vec3 g_color;" NL
			   "out StageData {" NL "  vec3 color;" NL "} g_vs_out;" NL
			   "layout(binding = 0, std430) buffer ObjectBuffer {" NL "  mat4 transform[4];" NL "  uint count[4];" NL
			   "  uint first_index[4];" NL "} g_objects;" NL "uniform int g_object_id;" NL "void main() {" NL
			   "  gl_Position = g_objects.transform[g_object_id] * g_position;" NL "  g_vs_out.color = g_color;" NL "}";

		const char* const glsl_fs =
			NL "in StageData {" NL "  vec3 color;" NL "} g_fs_in;" NL "layout(location = 0) out vec4 g_color;" NL
			   "void main() {" NL "  g_color = vec4(g_fs_in.color, 1);" NL "}";
		m_program[1] = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;
		glViewport(0, 0, 100, 100);

		/* object buffer */
		{
			struct
			{
				mat4   transform[4];
				GLuint count[4];
				GLuint first_index[4];
			} data = {
				{ tcu::translationMatrix(vec3(-1.5f, -0.5f, 0.0f)), tcu::translationMatrix(vec3(0.5f, -0.5f, 0.0f)),
				  tcu::translationMatrix(vec3(-0.5f, 0.5f, 0.0f)), tcu::translationMatrix(vec3(0.5f, 0.5f, 0.0f)) },
				{ 4, 4, 4, 4 },
				{ 0, 4, 8, 12 }
			};
			glGenBuffers(1, &m_object_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_object_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}
		/* vertex buffer */
		{
			const vec3 data[] = { vec3(-0.4f, -0.4f, 0.0f), vec3(1, 0, 0), vec3(0.4f, -0.4f, 0.0f), vec3(1, 0, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(1, 0, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(1, 0, 0),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(0, 1, 0), vec3(0.4f, -0.4f, 0.0f), vec3(0, 1, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(0, 1, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(0, 1, 0),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(0, 0, 1), vec3(0.4f, -0.4f, 0.0f), vec3(0, 0, 1),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(0, 0, 1), vec3(0.4f, 0.4f, 0.0f),  vec3(0, 0, 1),
								  vec3(-0.4f, -0.4f, 0.0f), vec3(1, 1, 0), vec3(0.4f, -0.4f, 0.0f), vec3(1, 1, 0),
								  vec3(-0.4f, 0.4f, 0.0f),  vec3(1, 1, 0), vec3(0.4f, 0.4f, 0.0f),  vec3(1, 1, 0) };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}
		/* index buffer */
		{
			const GLushort data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 };
			glGenBuffers(1, &m_index_buffer);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		}
		glGenBuffers(1, &m_draw_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_buffer);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, 4 * sizeof(GLuint) * 5, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(0, 3, GL_FLOAT, GL_FALSE, 2 * sizeof(vec3), 0);
		glVertexAttribPointer(1, 3, GL_FLOAT, GL_FALSE, 2 * sizeof(vec3), reinterpret_cast<void*>(sizeof(vec3)));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_index_buffer);
		glBindVertexArray(0);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_draw_buffer);
		glUseProgram(m_program[0]);
		glDispatchCompute(1, 1, 1);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, m_draw_buffer);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT);
		/* draw (CPU draw calls dispatch, could be done by the GPU with ARB_multi_draw_indirect) */
		{
			GLsizeiptr offset = 0;
			for (int i = 0; i < 4; ++i)
			{
				glUniform1i(glGetUniformLocation(m_program[1], "g_object_id"), i);
				glDrawElementsIndirect(GL_TRIANGLE_STRIP, GL_UNSIGNED_SHORT, reinterpret_cast<void*>(offset));
				offset += 5 * sizeof(GLuint);
			}
		}
		if (getWindowWidth() >= 100 && getWindowHeight() >= 100 &&
			!ValidateWindow4Quads(vec3(0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}